

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization.cpp
# Opt level: O0

void __thiscall CLocConstString::Reload(CLocConstString *this)

{
  int iVar1;
  char *pcVar2;
  undefined8 *in_RDI;
  char *pNewStr;
  uint in_stack_00000098;
  uint in_stack_0000009c;
  CLocalizationDatabase *in_stack_000000a0;
  
  iVar1 = CLocalizationDatabase::Version(&g_Localization);
  *(int *)(in_RDI + 3) = iVar1;
  pcVar2 = CLocalizationDatabase::FindString(in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
  in_RDI[1] = pcVar2;
  if (in_RDI[1] == 0) {
    in_RDI[1] = *in_RDI;
  }
  return;
}

Assistant:

void CLocConstString::Reload()
{
	m_Version = g_Localization.Version();
	const char *pNewStr = g_Localization.FindString(m_Hash, m_ContextHash);
	m_pCurrentStr = pNewStr;
	if(!m_pCurrentStr)
		m_pCurrentStr = m_pDefaultStr;
}